

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singledocparser.cpp
# Opt level: O3

void __thiscall
YAML::SingleDocParser::HandleBlockMap(SingleDocParser *this,EventHandler *eventHandler)

{
  deque<YAML::CollectionType::value,std::allocator<YAML::CollectionType::value>> *this_00;
  undefined4 *puVar1;
  pointer pcVar2;
  bool bVar3;
  Token *pTVar4;
  Exception *pEVar5;
  Token token;
  undefined1 local_a8 [12];
  int iStack_9c;
  undefined1 local_98 [24];
  undefined1 local_80 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  int local_58;
  string local_50;
  
  Scanner::pop(this->m_scanner);
  this_00 = (deque<YAML::CollectionType::value,std::allocator<YAML::CollectionType::value>> *)
            (this->m_pCollectionStack)._M_t.
            super___uniq_ptr_impl<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_>
            ._M_t.
            super__Tuple_impl<0UL,_YAML::CollectionStack_*,_std::default_delete<YAML::CollectionStack>_>
            .super__Head_base<0UL,_YAML::CollectionStack_*,_false>._M_head_impl;
  local_a8._0_4_ = INVALID;
  puVar1 = *(undefined4 **)(this_00 + 0x30);
  if (puVar1 == (undefined4 *)(*(long *)(this_00 + 0x40) + -4)) {
    std::deque<YAML::CollectionType::value,std::allocator<YAML::CollectionType::value>>::
    _M_push_back_aux<YAML::CollectionType::value_const&>(this_00,(value *)local_a8);
  }
  else {
    *puVar1 = 1;
    *(undefined4 **)(this_00 + 0x30) = puVar1 + 1;
  }
  do {
    bVar3 = Scanner::empty(this->m_scanner);
    if (bVar3) {
      pEVar5 = (Exception *)__cxa_allocate_exception(0x40);
      local_50._0_12_ = Scanner::mark(this->m_scanner);
      local_a8._0_8_ = local_98;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"end of map not found","");
      Exception::Exception(pEVar5,(Mark *)&local_50,(string *)local_a8);
      *(undefined ***)pEVar5 = &PTR__BadFile_008779d0;
      __cxa_throw(pEVar5,&ParserException::typeinfo,BadFile::~BadFile);
    }
    pTVar4 = Scanner::peek(this->m_scanner);
    local_a8._0_4_ = pTVar4->status;
    local_a8._4_4_ = pTVar4->type;
    local_a8._8_4_ = (pTVar4->mark).pos;
    iStack_9c = (pTVar4->mark).line;
    local_98._0_4_ = (pTVar4->mark).column;
    pcVar2 = (pTVar4->value)._M_dataplus._M_p;
    local_98._8_8_ = local_80;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_98 + 8),pcVar2,pcVar2 + (pTVar4->value)._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_70,&pTVar4->params);
    local_58 = pTVar4->data;
    if (local_a8._4_4_ == BLOCK_MAP_END) {
      Scanner::pop(this->m_scanner);
      bVar3 = false;
    }
    else {
      if (local_a8._4_4_ == KEY) {
        Scanner::pop(this->m_scanner);
        HandleNode(this,eventHandler);
      }
      else {
        if (local_a8._4_4_ != VALUE) {
          pEVar5 = (Exception *)__cxa_allocate_exception(0x40);
          local_50._M_dataplus._M_p = (pointer)((long)&local_50 + 0x10);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,"end of map not found","");
          Exception::Exception(pEVar5,(Mark *)(local_a8 + 8),&local_50);
          *(undefined ***)pEVar5 = &PTR__BadFile_008779d0;
          __cxa_throw(pEVar5,&ParserException::typeinfo,BadFile::~BadFile);
        }
        (*eventHandler->_vptr_EventHandler[4])(eventHandler,local_a8 + 8,0);
      }
      bVar3 = Scanner::empty(this->m_scanner);
      if (!bVar3) {
        pTVar4 = Scanner::peek(this->m_scanner);
        if (pTVar4->type == VALUE) {
          Scanner::pop(this->m_scanner);
          bVar3 = true;
          HandleNode(this,eventHandler);
          goto LAB_00719cc2;
        }
      }
      bVar3 = true;
      (*eventHandler->_vptr_EventHandler[4])(eventHandler,local_a8 + 8,0);
    }
LAB_00719cc2:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_70);
    if ((undefined1 *)local_98._8_8_ != local_80) {
      operator_delete((void *)local_98._8_8_);
    }
    if (!bVar3) {
      std::deque<YAML::CollectionType::value,_std::allocator<YAML::CollectionType::value>_>::
      pop_back((deque<YAML::CollectionType::value,_std::allocator<YAML::CollectionType::value>_> *)
               (this->m_pCollectionStack)._M_t.
               super___uniq_ptr_impl<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_>
               ._M_t.
               super__Tuple_impl<0UL,_YAML::CollectionStack_*,_std::default_delete<YAML::CollectionStack>_>
               .super__Head_base<0UL,_YAML::CollectionStack_*,_false>._M_head_impl);
      return;
    }
  } while( true );
}

Assistant:

void SingleDocParser::HandleBlockMap(EventHandler& eventHandler) {
  // eat start token
  m_scanner.pop();
  m_pCollectionStack->PushCollectionType(CollectionType::BlockMap);

  while (true) {
    if (m_scanner.empty())
      throw ParserException(m_scanner.mark(), ErrorMsg::END_OF_MAP);

    Token token = m_scanner.peek();
    if (token.type != Token::KEY && token.type != Token::VALUE &&
        token.type != Token::BLOCK_MAP_END)
      throw ParserException(token.mark, ErrorMsg::END_OF_MAP);

    if (token.type == Token::BLOCK_MAP_END) {
      m_scanner.pop();
      break;
    }

    // grab key (if non-null)
    if (token.type == Token::KEY) {
      m_scanner.pop();
      HandleNode(eventHandler);
    } else {
      eventHandler.OnNull(token.mark, NullAnchor);
    }

    // now grab value (optional)
    if (!m_scanner.empty() && m_scanner.peek().type == Token::VALUE) {
      m_scanner.pop();
      HandleNode(eventHandler);
    } else {
      eventHandler.OnNull(token.mark, NullAnchor);
    }
  }

  m_pCollectionStack->PopCollectionType(CollectionType::BlockMap);
}